

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_free_gatscat_buf(void)

{
  if (GA_prealloc_gatscat == 0) {
    pnga_error("Gather/scatter buffers not allocated",0);
  }
  GA_prealloc_gatscat = 0;
  pnga_free(GA_elems);
  pnga_free(GA_list);
  pnga_free(GA_header);
  return;
}

Assistant:

void pnga_free_gatscat_buf()
{
  if (!GA_prealloc_gatscat)
    pnga_error("Gather/scatter buffers not allocated",0);
  GA_prealloc_gatscat = 0;
  pnga_free(GA_elems);
  pnga_free(GA_list);
  pnga_free(GA_header);
}